

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O3

uint8_t __thiscall Controller::Read(Controller *this)

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  
  bVar1 = this->index;
  uVar2 = '\0';
  if ((ulong)bVar1 < 8) {
    uVar2 = this->buttons[bVar1];
  }
  uVar3 = '\0';
  if ((this->strobe & 1) == 0) {
    uVar3 = bVar1 + 1;
  }
  this->index = uVar3;
  return uVar2;
}

Assistant:

uint8_t Controller::Read() {
    uint8_t value = 0;
    if (index < 8 && buttons[index]) {
        value = 1;
    }
    index++;
    if (strobe & 1) {
        index = 0;
    }
    return value;
}